

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

shared_ptr<Token> __thiscall TokenBuffer::tokenAt(TokenBuffer *this,size_t i)

{
  bool bVar1;
  size_type sVar2;
  reference psVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Token> sVar5;
  shared_ptr<Token> *it;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *__range1;
  ulong local_48;
  size_t numWalked;
  ulong local_20;
  size_t i_local;
  TokenBuffer *this_local;
  shared_ptr<Token> *token;
  
  local_20 = in_RDX;
  i_local = i;
  this_local = this;
  while (sVar2 = std::__cxx11::
                 list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::size
                           ((list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                             *)i), sVar2 <= local_20) {
    std::__shared_ptr_access<Tokenizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Tokenizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               (i + 0x18));
    Tokenizer::currentToken((Tokenizer *)&stack0xffffffffffffffd0);
    std::__cxx11::list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::push_back
              ((list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)i,
               (value_type *)&stack0xffffffffffffffd0);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&stack0xffffffffffffffd0);
    std::__shared_ptr_access<Tokenizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Tokenizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               (i + 0x18));
    Tokenizer::nextToken((Tokenizer *)&numWalked);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&numWalked);
  }
  local_48 = 0;
  std::shared_ptr<Token>::shared_ptr((shared_ptr<Token> *)this);
  __end1 = std::__cxx11::list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::
           begin((list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)i);
  it = (shared_ptr<Token> *)
       std::__cxx11::list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::end
                 ((list<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)i);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    _Var4._M_pi = extraout_RDX;
    if (!bVar1) {
LAB_0013034f:
      sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
      sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<Token>)sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
    }
    psVar3 = std::_List_iterator<std::shared_ptr<Token>_>::operator*(&__end1);
    if (local_48 == local_20) {
      std::shared_ptr<Token>::operator=((shared_ptr<Token> *)this,psVar3);
      _Var4._M_pi = extraout_RDX_00;
      goto LAB_0013034f;
    }
    local_48 = local_48 + 1;
    std::_List_iterator<std::shared_ptr<Token>_>::operator++(&__end1);
  } while( true );
}

Assistant:

const std::shared_ptr<Token> TokenBuffer::tokenAt(std::size_t i) noexcept {
  while (this->tokenList.size() <= i) {
    this->tokenList.push_back(this->tokenizer->currentToken());
    this->tokenizer->nextToken();
  }

  std::size_t numWalked = 0;
  std::shared_ptr<Token> token;

  for (const auto & it : this->tokenList) {
    if (numWalked == i) {
      token = it;
      break;
    }
    numWalked++;
  }

  return token;
}